

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_markable.cpp
# Opt level: O2

void test_dual_storage_with_tuple_copy_ctor(void)

{
  bool bVar1;
  reference_type pDVar2;
  Date local_24;
  union_type local_20;
  opt_interval o2;
  DateInterval i12;
  
  DateInterval_value_ctor_calls_count = 0;
  DateInterval_copy_ctor_calls_count = 0;
  DateInterval_move_ctor_calls_count = 0;
  DateInterval_dtor_calls_count = 0;
  local_20._value._first._d = (Date)1;
  local_24._d = 2;
  DateInterval::DateInterval((DateInterval *)&o2,&local_20._value._first,&local_24);
  bVar1 = count_Interval_value_copy_move_dtror(1,0,0,0);
  if (!bVar1) {
    __assert_fail("count_Interval_value_copy_move_dtror(1, 0, 0, 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,900,"void test_dual_storage_with_tuple_copy_ctor()");
  }
  DateInterval::DateInterval(&local_20._value,(DateInterval *)&o2);
  if ((int)local_20._value._last._d < (int)local_20._value._first._d) {
    __assert_fail("o2.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x387,"void test_dual_storage_with_tuple_copy_ctor()");
  }
  pDVar2 = ak_toolkit::markable_ns::markable<mark_interval,_ak_toolkit::markable_ns::order_none>::
           value((markable<mark_interval,_ak_toolkit::markable_ns::order_none> *)&local_20._value);
  if (((Date)(pDVar2->_first)._d != o2._storage.value_._value._first._d) ||
     ((Date)(pDVar2->_last)._d != o2._storage.value_._value._last._d)) {
    __assert_fail("o2.value() == i12",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x388,"void test_dual_storage_with_tuple_copy_ctor()");
  }
  bVar1 = count_Interval_value_copy_move_dtror(1,1,0,0);
  if (!bVar1) {
    __assert_fail("count_Interval_value_copy_move_dtror(1, 1, 0, 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x389,"void test_dual_storage_with_tuple_copy_ctor()");
  }
  ak_toolkit::markable_ns::dual_storage<mark_interval>::~dual_storage
            ((dual_storage<mark_interval> *)&local_20._value);
  DateInterval::~DateInterval((DateInterval *)&o2);
  bVar1 = count_Interval_value_copy_move_dtror(1,1,0,2);
  if (bVar1) {
    return;
  }
  __assert_fail("count_Interval_value_copy_move_dtror(1, 1, 0, 2)",
                "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                ,0x38b,"void test_dual_storage_with_tuple_copy_ctor()");
}

Assistant:

void test_dual_storage_with_tuple_copy_ctor()
{
  reset_Interval_count();
  {
    typedef markable<mark_interval> opt_interval;
    DateInterval i12 {Date{1}, Date{2}};
    assert (count_Interval_value_copy_move_dtror(1, 0, 0, 0));

    opt_interval o2 {i12};
    assert (o2.has_value());
    assert (o2.value() == i12);
    assert (count_Interval_value_copy_move_dtror(1, 1, 0, 0));
  }
  assert (count_Interval_value_copy_move_dtror(1, 1, 0, 2));
}